

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

int __thiscall QFileDevice::close(QFileDevice *this,int __fd)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  FileError FVar4;
  QFileDevicePrivate *this_00;
  pointer pQVar5;
  long in_FS_OFFSET;
  bool flushed;
  QFileDevicePrivate *d;
  FileError in_stack_ffffffffffffffac;
  QIODevice *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  QFileDevice *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDevice *)0x1245aa);
  bVar2 = QIODevice::isOpen(in_stack_ffffffffffffffb0);
  if (bVar2) {
    bVar2 = flush(in_stack_fffffffffffffff0);
    QIODevice::close(&this->super_QIODevice,__fd);
    this_00->lastWasWrite = false;
    QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)in_stack_ffffffffffffffb0);
    this_00->cachedSize = 0;
    pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x124617);
    uVar3 = (*pQVar5->_vptr_QAbstractFileEngine[3])();
    if (((uVar3 & 1) == 0) || (!bVar2)) {
      if (bVar2) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x12465b);
        FVar4 = QAbstractFileEngine::error((QAbstractFileEngine *)this_00);
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x124678);
        QAbstractFileEngine::errorString
                  ((QAbstractFileEngine *)CONCAT44(FVar4,in_stack_ffffffffffffffb8));
        QFileDevicePrivate::setError(this_00,in_stack_ffffffffffffffac,(QString *)0x124698);
        QString::~QString((QString *)0x1246a2);
      }
    }
    else {
      unsetError((QFileDevice *)in_stack_ffffffffffffffb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QFileDevice::close()
{
    Q_D(QFileDevice);
    if (!isOpen())
        return;
    bool flushed = flush();
    QIODevice::close();

    // reset write buffer
    d->lastWasWrite = false;
    d->writeBuffer.clear();

    // reset cached size
    d->cachedSize = 0;

    // If flush() succeeded but close() failed, copy its error condition;
    // otherwise, keep the earlier flush() error.
    if (d->fileEngine->close() && flushed)
        unsetError();
    else if (flushed)
        d->setError(d->fileEngine->error(), d->fileEngine->errorString());
}